

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

void __thiscall QHexView::copyAs(QHexView *this,CopyMode mode)

{
  char cVar1;
  QHexDocument *pQVar2;
  bool bVar3;
  undefined8 uVar4;
  void *__buf;
  char *pcVar5;
  iterator pcVar6;
  ulong uVar7;
  QString hexchar;
  uint local_ac;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  undefined8 local_70;
  QByteArray bytes;
  QArrayDataPointer<char16_t> local_48;
  
  uVar4 = QGuiApplication::clipboard();
  bVar3 = QHexCursor::hasSelection(this->m_hexcursor);
  if (bVar3) {
    QHexCursor::selectedBytes(&bytes,this->m_hexcursor);
  }
  else {
    pQVar2 = this->m_hexdocument;
    __buf = (void *)QHexCursor::offset(this->m_hexcursor);
    QHexDocument::read((QHexDocument *)&bytes,(int)pQVar2,__buf,1);
  }
  if (mode - HexArraySquare < 2) {
    hexchar.d.d = (Data *)0x0;
    hexchar.d.ptr = (char16_t *)0x0;
    hexchar.d.size = 0;
    pcVar5 = QByteArray::data(&bytes);
    local_70 = uVar4;
    pcVar6 = QByteArray::end(&bytes);
    local_ac = 0;
    for (; pcVar5 != pcVar6; pcVar5 = pcVar5 + 1) {
      cVar1 = *pcVar5;
      if (hexchar.d.size != 0) {
        QString::operator+=(&hexchar,", ");
        if (((this->m_options).copybreak == true) &&
           (local_ac = local_ac + 1, local_ac % (this->m_options).linelength == 0)) {
          QString::operator+=(&hexchar,"\n");
        }
      }
      QString::number((uint)&local_48,(int)cVar1);
      QString::toUpper_helper((QString *)&local_a0);
      operator+((QString *)&local_88,"0x",(QString *)&local_a0);
      QString::append((QString *)&hexchar);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
    pcVar5 = "{%1}";
    if (mode == HexArraySquare) {
      pcVar5 = "[%1]";
    }
    QString::QString((QString *)&local_a0,pcVar5);
    QString::arg((QString *)&local_88,(int)&local_a0,(QChar)(char16_t)&hexchar);
    QClipboard::setText(local_70,&local_88,0);
  }
  else {
    if (mode != HexArrayChar) {
      hexchar.d.d = (Data *)0x0;
      hexchar.d.ptr = (char16_t *)0x0;
      hexchar.d.size = 0;
      for (uVar7 = 0; (long)uVar7 < bytes.d.size; uVar7 = uVar7 + 1) {
        if ((int)((uVar7 & 0xffffffff) % (ulong)(this->m_options).grouplength) == 0) {
          if (hexchar.d.size != 0) {
            QString::operator+=(&hexchar,", ");
            if (((this->m_options).copybreak == true) &&
               ((int)((uVar7 & 0xffffffff) % (ulong)(this->m_options).linelength) == 0)) {
              QString::operator+=(&hexchar,"\n");
            }
          }
          QString::operator+=(&hexchar,"0x");
        }
        QString::QString((QString *)&local_48,"%1");
        pcVar5 = QByteArray::data(&bytes);
        QString::arg((ulonglong)&local_a0,(int)&local_48,(int)pcVar5[uVar7],(QChar)0x2);
        QString::toUpper_helper((QString *)&local_88);
        QString::append((QString *)&hexchar);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      }
      QClipboard::setText(uVar4,&hexchar,0);
      goto LAB_0019236a;
    }
    hexchar.d.d = (Data *)0x0;
    hexchar.d.ptr = (char16_t *)0x0;
    hexchar.d.size = 0;
    pcVar5 = QByteArray::data(&bytes);
    local_70 = uVar4;
    pcVar6 = QByteArray::end(&bytes);
    for (; pcVar5 != pcVar6; pcVar5 = pcVar5 + 1) {
      QString::number((uint)&local_48,(int)*pcVar5);
      QString::toUpper_helper((QString *)&local_a0);
      operator+((QString *)&local_88,"\\x",(QString *)&local_a0);
      QString::append((QString *)&hexchar);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
    QString::QString((QString *)&local_a0,"\"%1\"");
    QString::arg((QString *)&local_88,(int)&local_a0,(QChar)(char16_t)&hexchar);
    QClipboard::setText(local_70,&local_88,0);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
LAB_0019236a:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&hexchar.d);
  QArrayDataPointer<char>::~QArrayDataPointer(&bytes.d);
  return;
}

Assistant:

void QHexView::copyAs(CopyMode mode) const {
    QClipboard* c = qApp->clipboard();

    QByteArray bytes = m_hexcursor->hasSelection()
                           ? m_hexcursor->selectedBytes()
                           : m_hexdocument->read(m_hexcursor->offset(), 1);

    switch(mode) {
        case CopyMode::HexArrayCurly:
        case CopyMode::HexArraySquare: {
            QString hexchar;
            int i = 0;

            for(char b : bytes) {
                if(!hexchar.isEmpty()) {
                    hexchar += ", ";
                    if(m_options.copybreak && !(++i % m_options.linelength))
                        hexchar += "\n";
                }

                hexchar +=
                    "0x" + QString::number(static_cast<uint>(b), 16).toUpper();
            }

            c->setText(
                QString(mode == CopyMode::HexArraySquare ? "[%1]" : "{%1}")
                    .arg(hexchar));
            break;
        }

        case CopyMode::HexArrayChar: {
            QString hexchar;

            for(char b : bytes)
                hexchar +=
                    "\\x" + QString::number(static_cast<uint>(b), 16).toUpper();

            c->setText(QString("\"%1\"").arg(hexchar));
            break;
        }

        default: {
            QString hexchar;

            for(int i = 0; i < bytes.size(); i++) {
                if(!(i % m_options.grouplength)) {
                    if(!hexchar.isEmpty()) {
                        hexchar += ", ";
                        if(m_options.copybreak && !(i % m_options.linelength))
                            hexchar += "\n";
                    }

                    hexchar += "0x";
                }

                hexchar += QString("%1")
                               .arg(static_cast<uint>(bytes[i]), 2, 16,
                                    QLatin1Char('0'))
                               .toUpper();
            }

            c->setText(hexchar);
            break;
        }
    }
}